

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O2

bool __thiscall re2::Tester::TestInput(Tester *this,StringPiece *text)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  StringPiece local_38;
  
  bVar1 = TestInputInContext(this,text,text);
  if (0 < text->length_) {
    local_38.ptr_ = text->ptr_ + 1;
    local_38.length_ = text->length_ + -1;
    bVar2 = TestInputInContext(this,&local_38,text);
    local_38.ptr_ = text->ptr_;
    local_38.length_ = text->length_ + -1;
    bVar3 = TestInputInContext(this,&local_38,text);
    bVar1 = bVar1 && (bVar3 && bVar2);
  }
  return bVar1;
}

Assistant:

bool Tester::TestInput(const StringPiece& text) {
  bool okay = TestInputInContext(text, text);
  if (text.size() > 0) {
    StringPiece sp;
    sp = text;
    sp.remove_prefix(1);
    okay &= TestInputInContext(sp, text);
    sp = text;
    sp.remove_suffix(1);
    okay &= TestInputInContext(sp, text);
  }
  return okay;
}